

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayoutPrivate::setupHfwLayoutData(QFormLayoutPrivate *this)

{
  QFormLayoutItem *pQVar1;
  QFormLayoutItem *pQVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  const_reference pQVar10;
  reference pQVar11;
  QFormLayoutItem **ppQVar12;
  int *piVar13;
  QFormLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  int hfw_1;
  int hfw;
  QFormLayoutItem *field;
  QFormLayoutItem *label;
  int rr;
  int i;
  QFormLayout *q;
  int omh;
  int oh;
  int mh;
  int h;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int local_2c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  iVar7 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::rowCount
                    ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)0x4b352e);
  QList<QLayoutStruct>::clear
            ((QList<QLayoutStruct> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  QList<QLayoutStruct>::resize
            ((QList<QLayoutStruct> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  for (local_2c = 0; local_2c < in_RDI->vLayoutCount; local_2c = local_2c + 1) {
    pQVar10 = QList<QLayoutStruct>::at
                        ((QList<QLayoutStruct> *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    pQVar11 = QList<QLayoutStruct>::operator[]
                        ((QList<QLayoutStruct> *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    iVar8 = pQVar10->sizeHint;
    pQVar11->stretch = pQVar10->stretch;
    pQVar11->sizeHint = iVar8;
    iVar8 = pQVar10->minimumSize;
    pQVar11->maximumSize = pQVar10->maximumSize;
    pQVar11->minimumSize = iVar8;
    bVar6 = pQVar10->expansive;
    bVar3 = pQVar10->empty;
    bVar4 = pQVar10->done;
    uVar5 = pQVar10->field_0x17;
    pQVar11->spacing = pQVar10->spacing;
    pQVar11->expansive = bVar6;
    pQVar11->empty = bVar3;
    pQVar11->done = bVar4;
    pQVar11->field_0x17 = uVar5;
    iVar8 = pQVar10->size;
    pQVar11->pos = pQVar10->pos;
    pQVar11->size = iVar8;
  }
  for (local_2c = 0; local_2c < iVar7; local_2c = local_2c + 1) {
    ppQVar12 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                         ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    pQVar1 = *ppQVar12;
    ppQVar12 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                         ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    pQVar2 = *ppQVar12;
    bVar6 = QFormLayout::isRowVisible
                      ((QFormLayout *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff9c);
    if (bVar6) {
      if ((pQVar1 != (QFormLayoutItem *)0x0) && (-1 < pQVar1->vLayoutIndex)) {
        if ((pQVar1->isHfw & 1U) == 0) {
          iVar8 = QSize::height((QSize *)0x4b36e4);
          pQVar11 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          pQVar11->sizeHint = iVar8;
          in_stack_ffffffffffffff9c = QSize::height((QSize *)0x4b3717);
          pQVar11 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          pQVar11->minimumSize = in_stack_ffffffffffffff9c;
        }
        else {
          in_stack_ffffffffffffffa4 =
               QFormLayoutItem::heightForWidth
                         ((QFormLayoutItem *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c);
          in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa4;
          pQVar11 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          pQVar11->minimumSize = in_stack_ffffffffffffffa0;
          pQVar11 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          pQVar11->sizeHint = in_stack_ffffffffffffffa4;
        }
      }
      if ((pQVar2 != (QFormLayoutItem *)0x0) && (-1 < pQVar2->vLayoutIndex)) {
        if ((pQVar2->isHfw & 1U) == 0) {
          iVar8 = 0;
        }
        else {
          iVar8 = QFormLayoutItem::heightForWidth
                            ((QFormLayoutItem *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff7c);
        }
        iVar9 = iVar8;
        if ((pQVar2->isHfw & 1U) == 0) {
          iVar9 = QSize::height((QSize *)0x4b37af);
        }
        local_c = iVar9;
        if ((pQVar2->isHfw & 1U) == 0) {
          iVar8 = QSize::height((QSize *)0x4b37de);
        }
        local_10 = iVar8;
        if ((pQVar2->sideBySide & 1U) == 0) {
          in_stack_ffffffffffffff7c = local_c;
          pQVar11 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               CONCAT44(local_c,in_stack_ffffffffffffff78));
          pQVar11->sizeHint = in_stack_ffffffffffffff7c;
          in_stack_ffffffffffffff80 = local_10;
          pQVar11 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)CONCAT44(in_stack_ffffffffffffff84,local_10),
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          pQVar11->minimumSize = in_stack_ffffffffffffff80;
        }
        else {
          pQVar10 = QList<QLayoutStruct>::at
                              ((QList<QLayoutStruct> *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          local_14 = pQVar10->sizeHint;
          pQVar10 = QList<QLayoutStruct>::at
                              ((QList<QLayoutStruct> *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          local_18 = pQVar10->minimumSize;
          piVar13 = qMax<int>(&local_c,&local_14);
          in_stack_ffffffffffffff84 = *piVar13;
          pQVar11 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          pQVar11->sizeHint = in_stack_ffffffffffffff84;
          piVar13 = qMax<int>(&local_10,&local_18);
          iVar8 = *piVar13;
          pQVar11 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          pQVar11->minimumSize = iVar8;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFormLayoutPrivate::setupHfwLayoutData()
{
    Q_Q(QFormLayout);
    // setupVerticalLayoutData must be called before this
    // setupHorizontalLayoutData must also be called before this
    // copies non hfw data into hfw
    // then updates size and min


    // Note: QGridLayout doesn't call minimumHeightForWidth,
    // but instead uses heightForWidth for both min and sizeHint.
    // For the common case where minimumHeightForWidth just calls
    // heightForWidth, we do the calculation twice, which can be
    // very expensive for word wrapped QLabels/QTextEdits, for example.
    // So we just use heightForWidth as well.
    int i;
    int rr = m_matrix.rowCount();

    hfwLayouts.clear();
    hfwLayouts.resize(vLayoutCount);
    for (i = 0; i < vLayoutCount; ++i)
        hfwLayouts[i] = vLayouts.at(i);

    for (i = 0; i < rr; ++i) {
        QFormLayoutItem *label = m_matrix(i, 0);
        QFormLayoutItem *field = m_matrix(i, 1);

        // ignore rows with only hidden items
        if (!q->isRowVisible(i))
            continue;

        if (label && label->vLayoutIndex > -1) {
            if (label->isHfw) {
                // We don't check sideBySide here, since a label is only
                // ever side by side with its field
                int hfw = label->heightForWidth(label->layoutWidth);
                hfwLayouts[label->vLayoutIndex].minimumSize = hfw;
                hfwLayouts[label->vLayoutIndex].sizeHint = hfw;
            } else {
                // Reset these here, so the field can do a qMax below (the previous value may have
                // been the fields non-hfw values, which are often larger than hfw)
                hfwLayouts[label->vLayoutIndex].sizeHint = label->sizeHint.height();
                hfwLayouts[label->vLayoutIndex].minimumSize = label->minSize.height();
            }
        }

        if (field && field->vLayoutIndex > -1) {
            int hfw = field->isHfw ? field->heightForWidth(field->layoutWidth) : 0;
            int h = field->isHfw ? hfw : field->sizeHint.height();
            int mh = field->isHfw ? hfw : field->minSize.height();

            if (field->sideBySide) {
                int oh = hfwLayouts.at(field->vLayoutIndex).sizeHint;
                int omh = hfwLayouts.at(field->vLayoutIndex).minimumSize;

                hfwLayouts[field->vLayoutIndex].sizeHint = qMax(h, oh);
                hfwLayouts[field->vLayoutIndex].minimumSize = qMax(mh, omh);
            } else {
                hfwLayouts[field->vLayoutIndex].sizeHint = h;
                hfwLayouts[field->vLayoutIndex].minimumSize = mh;
            }
        }
    }
}